

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io.cpp
# Opt level: O0

void lume::ParseElementIndicesToArrayAnnex<unsigned_int>
               (SPMesh *mesh,string *annexName,xml_node<char> *node,uint value,GrobSet *gs)

{
  index_t ind;
  element_type *mesh_00;
  char *__s;
  value_type_conflict3 *pvVar1;
  GrobIndex local_140;
  GrobIndex ig;
  char *p;
  shared_ptr<lume::Mesh> local_128;
  undefined1 local_118 [8];
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> annexTable;
  vector<lume::grob_t,_std::allocator<lume::grob_t>_> local_78;
  undefined1 local_60 [8];
  TotalToGrobIndexMap indMap;
  GrobSet *gs_local;
  uint value_local;
  xml_node<char> *node_local;
  string *annexName_local;
  SPMesh *mesh_local;
  
  if (node != (xml_node<char> *)0x0) {
    indMap.m_grobTypes.super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &gs->m_offset;
    mesh_00 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )mesh);
    UGXGrobTypeArrayFromGrobSet
              (&local_78,
               (GrobSet *)
               indMap.m_grobTypes.super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    TotalToGrobIndexMap::TotalToGrobIndexMap((TotalToGrobIndexMap *)local_60,mesh_00,&local_78);
    std::vector<lume::grob_t,_std::allocator<lume::grob_t>_>::~vector(&local_78);
    std::shared_ptr<lume::Mesh>::shared_ptr(&local_128,mesh);
    ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::ArrayAnnexTable
              ((ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> *)local_118,&local_128,annexName,
               (GrobSet)*indMap.m_grobTypes.
                         super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,true);
    std::shared_ptr<lume::Mesh>::~shared_ptr(&local_128);
    ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::resize_annexes_to_match_grobs
              ((ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> *)local_118,1);
    __s = rapidxml::xml_base<char>::value(&node->super_xml_base<char>);
    ig = (GrobIndex)strtok(__s," ");
    while (ig != (GrobIndex)0x0) {
      ind = atoi((char *)ig);
      local_140 = TotalToGrobIndexMap::operator()((TotalToGrobIndexMap *)local_60,ind);
      pvVar1 = ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::operator[]
                         ((ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> *)local_118,&local_140);
      *pvVar1 = value;
      ig = (GrobIndex)strtok((char *)0x0," ");
    }
    ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::~ArrayAnnexTable
              ((ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> *)local_118);
    TotalToGrobIndexMap::~TotalToGrobIndexMap((TotalToGrobIndexMap *)local_60);
  }
  return;
}

Assistant:

static void ParseElementIndicesToArrayAnnex (SPMesh& mesh,
                                            const string& annexName,
                                            xml_node<>* node,
                                            const T value,
                                            const GrobSet& gs)
{
	if (!node) return;
	
	// indices in the node are referring to all elements of one dimension.
	// we have to map them to indices of individual grob types.
	TotalToGrobIndexMap indMap (*mesh, UGXGrobTypeArrayFromGrobSet (gs));

	ArrayAnnexTable <ArrayAnnex<T>> annexTable (mesh, annexName, gs, true);
	annexTable.resize_annexes_to_match_grobs (1);

	// parse the node values and assign indices
	char* p = strtok (node->value(), " ");
	while (p) {
		const auto ig = indMap (index_t (atoi(p)));
		annexTable [ig] = value;
		p = strtok (nullptr, " ");
	}
}